

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Bar.cxx
# Opt level: O0

void __thiscall Fl_Menu_Bar::draw(Fl_Menu_Bar *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Fl_Boxtype FVar4;
  Fl_Menu_Item *pFVar5;
  int y2;
  int y1;
  int W;
  int X;
  Fl_Menu_Item *m;
  Fl_Menu_Bar *this_local;
  
  Fl_Widget::draw_box((Fl_Widget *)this);
  pFVar5 = Fl_Menu_::menu(&this->super_Fl_Menu_);
  if ((pFVar5 != (Fl_Menu_Item *)0x0) &&
     (pFVar5 = Fl_Menu_::menu(&this->super_Fl_Menu_), pFVar5->text != (char *)0x0)) {
    iVar1 = Fl_Widget::x((Fl_Widget *)this);
    y1 = iVar1 + 6;
    pFVar5 = Fl_Menu_::menu(&this->super_Fl_Menu_);
    for (_W = Fl_Menu_Item::first(pFVar5); _W->text != (char *)0x0; _W = Fl_Menu_Item::next(_W,1)) {
      iVar1 = Fl_Menu_Item::measure(_W,(int *)0x0,&this->super_Fl_Menu_);
      iVar2 = Fl_Widget::y((Fl_Widget *)this);
      iVar3 = Fl_Widget::h((Fl_Widget *)this);
      Fl_Menu_Item::draw(_W,y1,iVar2,iVar1 + 0x10,iVar3,&this->super_Fl_Menu_,0);
      y1 = iVar1 + 0x10 + y1;
      if ((_W->flags & 0x80U) != 0) {
        iVar2 = Fl_Widget::y((Fl_Widget *)this);
        FVar4 = Fl_Widget::box((Fl_Widget *)this);
        iVar1 = Fl::box_dy(FVar4);
        iVar2 = iVar2 + iVar1;
        iVar1 = Fl_Widget::h((Fl_Widget *)this);
        FVar4 = Fl_Widget::box((Fl_Widget *)this);
        iVar3 = Fl::box_dh(FVar4);
        iVar1 = ((iVar2 + iVar1) - iVar3) + -1;
        fl_color(0x27);
        fl_yxline(y1 + -6,iVar2,iVar1);
        fl_color(0x36);
        fl_yxline(y1 + -5,iVar2,iVar1);
      }
    }
  }
  return;
}

Assistant:

void Fl_Menu_Bar::draw() {
  draw_box();
  if (!menu() || !menu()->text) return;
  const Fl_Menu_Item* m;
  int X = x()+6;
  for (m=menu()->first(); m->text; m = m->next()) {
    int W = m->measure(0,this) + 16;
    m->draw(X, y(), W, h(), this);
    X += W;
    if (m->flags & FL_MENU_DIVIDER) {
      int y1 = y() + Fl::box_dy(box());
      int y2 = y1 + h() - Fl::box_dh(box()) - 1;

      // Draw a vertical divider between menus...
      fl_color(FL_DARK3);
      fl_yxline(X - 6, y1, y2);
      fl_color(FL_LIGHT3);
      fl_yxline(X - 5, y1, y2);
    }
  }
}